

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.cpp
# Opt level: O1

void __thiscall JSONParser::load_file(JSONParser *this,string *filename)

{
  vector<char,_std::allocator<char>_> *this_00;
  ulong uVar1;
  long lVar2;
  size_type __new_size;
  ifstream is;
  value_type local_231;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    this_00 = &this->m_buffer;
    local_231 = '\0';
    std::vector<char,_std::allocator<char>_>::resize(this_00,0x100,&local_231);
    if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 2) == 0) {
      __new_size = 0;
      do {
        if (__new_size != 0) {
          uVar1 = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_231 = '\0';
          std::vector<char,_std::allocator<char>_>::resize(this_00,(uVar1 >> 1) + uVar1,&local_231);
        }
        lVar2 = std::istream::read((char *)local_230,
                                   (long)((this->m_buffer).
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data._M_start + __new_size));
        __new_size = __new_size + *(long *)(lVar2 + 8);
      } while ((abStack_210[*(long *)(local_230[0] + -0x18)] & 2) == 0);
    }
    else {
      __new_size = 0;
    }
    std::vector<char,_std::allocator<char>_>::resize(this_00,__new_size);
    this->m_buffer_loaded = true;
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void JSONParser::load_file(std::string filename)
{
    std::ifstream is(filename.c_str());
    // If couldn't load
    if (!is) {
        return;
    }
    // Ignore previous data if any
    m_buffer.resize(256, 0);
    size_t len = 0;

    while (!is.eof()) {
        if (len > 0) {
            m_buffer.resize(m_buffer.size() +
                    m_buffer.size() / 2, 0);
        }
        len += is.read(&m_buffer[len],
                m_buffer.size() - len).gcount();
    }
    m_buffer.resize(len);
    m_buffer_loaded = true;
}